

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandBuffer.cpp
# Opt level: O0

void __thiscall
myvk::CommandBuffer::CmdBeginRenderPass
          (CommandBuffer *this,Ptr<RenderPass> *render_pass,Ptr<Framebuffer> *framebuffer,
          vector<VkClearValue,_std::allocator<VkClearValue>_> *clear_values,VkOffset2D *offset,
          VkExtent2D *extent,VkSubpassContents subpass_contents)

{
  element_type *this_00;
  element_type *this_01;
  size_type sVar1;
  vector<VkClearValue,_std::allocator<VkClearValue>_> *in_RCX;
  long in_RDI;
  VkOffset2D *in_R8;
  VkExtent2D *in_R9;
  VkRenderPassBeginInfo render_begin_info;
  VkRenderPassBeginInfo local_70;
  VkExtent2D *local_30;
  VkOffset2D *local_28;
  vector<VkClearValue,_std::allocator<VkClearValue>_> *local_20;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  memset(&local_70,0,0x40);
  local_70.sType = VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO;
  this_00 = std::__shared_ptr_access<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2ac175);
  local_70.renderPass = RenderPass::GetHandle(this_00);
  this_01 = std::__shared_ptr_access<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2ac18c);
  local_70.framebuffer = FramebufferBase::GetHandle(&this_01->super_FramebufferBase);
  local_70.renderArea.offset = *local_28;
  local_70.renderArea.extent = *local_30;
  sVar1 = std::vector<VkClearValue,_std::allocator<VkClearValue>_>::size(local_20);
  local_70.clearValueCount = (uint32_t)sVar1;
  local_70.pClearValues =
       std::vector<VkClearValue,_std::allocator<VkClearValue>_>::data
                 ((vector<VkClearValue,_std::allocator<VkClearValue>_> *)0x2ac1cb);
  (*vkCmdBeginRenderPass)(*(VkCommandBuffer *)(in_RDI + 0x28),&local_70,render_begin_info.sType);
  return;
}

Assistant:

void CommandBuffer::CmdBeginRenderPass(const Ptr<RenderPass> &render_pass, const Ptr<Framebuffer> &framebuffer,
                                       const std::vector<VkClearValue> &clear_values, const VkOffset2D &offset,
                                       const VkExtent2D &extent, VkSubpassContents subpass_contents) const {
	VkRenderPassBeginInfo render_begin_info = {};
	render_begin_info.sType = VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO;
	render_begin_info.renderPass = render_pass->GetHandle();
	render_begin_info.framebuffer = framebuffer->GetHandle();
	render_begin_info.renderArea.offset = offset;
	render_begin_info.renderArea.extent = extent;
	render_begin_info.clearValueCount = clear_values.size();
	render_begin_info.pClearValues = clear_values.data();

	vkCmdBeginRenderPass(m_command_buffer, &render_begin_info, subpass_contents);
}